

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::inverse(matrix3d *__return_storage_ptr__,matrix3d *_m)

{
  V *pVVar1;
  double *pdVar2;
  mat<double,_3,_3> *a;
  undefined1 local_a0 [8];
  matrix33d inv_m;
  matrix33d m;
  matrix3d *_m_local;
  
  linalg::mat<double,_3,_3>::mat((mat<double,_3,_3> *)&inv_m.z.z);
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&inv_m.z.z,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  memcpy(pdVar2,_m,0x48);
  linalg::inverse<double,3>((mat<double,_3,_3> *)local_a0,(linalg *)&inv_m.z.z,a);
  value::matrix3d::matrix3d(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_a0,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  memcpy(__return_storage_ptr__,pdVar2,0x48);
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d inverse(const value::matrix3d &_m) {
  matrix33d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 3 * 3);

  matrix33d inv_m = linalg::inverse(m);

  value::matrix3d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 3 * 3);

  return outm;
}